

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O1

int read_unaligned_addr_check
              (Dwarf_Debug dbg,Dwarf_Addr *addr_out,Dwarf_Small *rangeptr,uint address_size,
              Dwarf_Error *error,Dwarf_Small *section_end)

{
  Dwarf_Small *pDVar1;
  Dwarf_Addr _ltmp;
  Dwarf_Addr local_28;
  
  local_28 = 0;
  pDVar1 = rangeptr + address_size;
  if (section_end < pDVar1) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
    local_28 = 0;
  }
  else {
    (*dbg->de_copy_word)(&local_28,rangeptr,(ulong)address_size);
  }
  if (section_end >= pDVar1) {
    *addr_out = local_28;
  }
  return (uint)(section_end < pDVar1);
}

Assistant:

static int
read_unaligned_addr_check(Dwarf_Debug dbg,
    Dwarf_Addr *addr_out,
    Dwarf_Small *rangeptr,
    unsigned address_size,
    Dwarf_Error *error,
    Dwarf_Small *section_end)
{
    Dwarf_Addr a = 0;

    READ_UNALIGNED_CK(dbg,a,
        Dwarf_Addr, rangeptr,
        address_size,
        error,section_end);
    *addr_out = a;
    return DW_DLV_OK;
}